

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O3

vector<Interval,_std::allocator<Interval>_> *
getTracked(vector<Interval,_std::allocator<Interval>_> *__return_storage_ptr__,Database *database,
          Rules *rules,IntervalFilter *filter)

{
  pointer pIVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  int iVar5;
  pointer __a;
  value_type *__x;
  Interval *__b;
  iterator it;
  Interval latest;
  iterator end;
  undefined1 local_150 [32];
  iterator local_130;
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100 [5];
  int local_a8;
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  iterator local_50;
  
  (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Database::begin(&local_130,database);
  Database::end(&local_50,database);
  bVar2 = Database::iterator::operator!=(&local_130,&local_50);
  iVar5 = 0;
  if (bVar2) {
    psVar4 = Database::iterator::operator*[abi_cxx11_(&local_130);
    IntervalFactory::fromSerialization((Interval *)local_110,psVar4);
    Database::iterator::operator++(&local_130);
    expandLatest((vector<Interval,_std::allocator<Interval>_> *)local_150,(Interval *)local_110,
                 rules);
    if (local_150._0_8_ != local_150._8_8_) {
      iVar5 = 1;
      __x = (value_type *)local_150._0_8_;
      do {
        iVar3 = (**filter->_vptr_IntervalFilter)(filter,__x);
        if ((char)iVar3 == '\0') {
          bVar2 = IntervalFilter::is_done(filter);
          if (bVar2 || __x + 1 == (value_type *)local_150._8_8_) goto LAB_0015610f;
        }
        else {
          __x->id = iVar5;
          std::vector<Interval,_std::allocator<Interval>_>::push_back(__return_storage_ptr__,__x);
          if (__x + 1 == (value_type *)local_150._8_8_) goto LAB_0015610f;
        }
        __x = __x + 1;
        iVar5 = iVar5 + 1;
      } while( true );
    }
    iVar5 = 0;
LAB_0015610f:
    std::vector<Interval,_std::allocator<Interval>_>::~vector
              ((vector<Interval,_std::allocator<Interval>_> *)local_150);
    local_110._0_8_ = &PTR__Interval_0019f6e8;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_p != &local_90) {
      operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
    }
  }
  while( true ) {
    iVar5 = iVar5 + 1;
    bVar2 = Database::iterator::operator!=(&local_130,&local_50);
    if (!bVar2) break;
    psVar4 = Database::iterator::operator*[abi_cxx11_(&local_130);
    IntervalFactory::fromSerialization((Interval *)local_110,psVar4);
    local_a8 = iVar5;
    iVar3 = (**filter->_vptr_IntervalFilter)(filter,(Interval *)local_110);
    if ((char)iVar3 == '\0') {
      bVar2 = IntervalFilter::is_done(filter);
      if (!bVar2) goto LAB_001561d3;
      bVar2 = false;
    }
    else {
      std::vector<Interval,_std::allocator<Interval>_>::emplace_back<Interval>
                (__return_storage_ptr__,(Interval *)local_110);
LAB_001561d3:
      bVar2 = true;
    }
    local_110._0_8_ = &PTR__Interval_0019f6e8;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_p != &local_90) {
      operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
    }
    if (!bVar2) break;
    Database::iterator::operator++(&local_130);
  }
  local_150._0_8_ = (pointer)(local_150 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_150,"Loaded {1} tracked intervals","");
  format<unsigned_long>
            ((string *)local_110,1,(string *)local_150,
             ((long)(__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 6) * -0x5555555555555555);
  debug((string *)local_110);
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,local_100[0]._M_allocated_capacity + 1);
  }
  if ((pointer)local_150._0_8_ != (pointer)(local_150 + 0x10)) {
    operator_delete((void *)local_150._0_8_,(ulong)(local_150._16_8_ + 1));
  }
  __a = (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
        super__Vector_impl_data._M_start;
  pIVar1 = (__return_storage_ptr__->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  __b = pIVar1 + -1;
  if (__a < __b && __a != pIVar1) {
    do {
      std::swap<Interval>(__a,__b);
      __a = __a + 1;
      __b = __b + -1;
    } while (__a < __b);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector <Interval> getTracked (
  Database& database,
  const Rules& rules,
  IntervalFilter& filter)
{
  int current_id = 0;
  std::vector <Interval> intervals;

  auto it = database.begin ();
  auto end = database.end ();

  // Because the latest recorded interval may be expanded into synthetic
  // intervals, we'll handle it specially
  if (it != end )
  {
    Interval latest = IntervalFactory::fromSerialization (*it);
    ++it;

    for (auto& interval : expandLatest (latest, rules))
    {
      ++current_id;
      if (filter.accepts (interval))
      {
        interval.id = current_id;
        intervals.push_back (interval);
      }
      else if (filter.is_done ())
      {
        break;
      }
    }
  }

  for (; it != end; ++it)
  {
    Interval interval = IntervalFactory::fromSerialization (*it);
    interval.id = ++current_id;

    if (filter.accepts (interval))
    {
      intervals.push_back (std::move (interval));
    }
    else if (filter.is_done ())
    {
      // Since we are moving backwards in time, and the intervals are in sorted
      // order, if the filter is after the interval, we know there will be no
      // more matches
      break;
    }
  }

  debug (format ("Loaded {1} tracked intervals", intervals.size ()));

  // By default, intervals are sorted by id, but getTracked needs to return the
  // intervals sorted by date, which are ids in reverse order.
  std::reverse (intervals.begin (), intervals.end ());

  return intervals;
}